

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

void __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::solver_inequalities_Zcoeff
          (solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[]>_>
  *__num;
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
  *__num_00;
  _Rb_tree_header *p_Var1;
  pointer constraint_elements;
  uint uVar2;
  subsolver_type *psVar3;
  pointer pmVar4;
  long lVar5;
  pointer pfVar6;
  int *piVar7;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *this_00;
  size_t sVar8;
  subsolver_type sVar9;
  int iVar10;
  long lVar11;
  int bk_max;
  int iVar12;
  bound_factor *pbVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  size_t sVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  string_view name;
  string_view fmt;
  ulong local_90;
  size_t local_z_variables_max;
  int local_7c;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_float> *local_78;
  size_t local_70;
  solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *local_68;
  unique_ptr<int[],_std::default_delete<int[]>_> *local_60;
  unique_ptr<float[],_std::default_delete<float[]>_> *local_58;
  unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
  *local_50;
  unique_ptr<float[],_std::default_delete<float[]>_> *local_48;
  sparse_matrix<int> *local_40;
  ulong local_38;
  
  name._M_str = "solver_inequalities_Zcoeff";
  name._M_len = 0x1a;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  local_68 = this;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  local_40 = &this->ap;
  std::make_unique<float[]>((size_t)&this->P);
  local_60 = &this->A;
  local_48 = &this->P;
  std::make_unique<int[]>((size_t)local_60);
  compute_reduced_costs_vector_size(csts);
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data[]>
            ((size_t)&this->R);
  __num = &this->Z;
  local_50 = &this->R;
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::subsolver_type[]>
            ((size_t)__num);
  __num_00 = &this->b;
  std::
  make_unique<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::bound_factor[]>
            ((size_t)__num_00);
  local_58 = &this->pi;
  std::make_unique<float[]>((size_t)local_58);
  local_78 = &this->bb;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->bb).subvector.m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bb).subvector.m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb).subvector.m_free_list_head = 0xffffffff;
  p_Var1 = &(this->ex).constraints._M_t._M_impl.super__Rb_tree_header;
  auVar18 = ZEXT432(0) << 0x40;
  (this->bb).items =
       (vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
        )auVar18._0_24_;
  (this->bb).nodes.
  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar18._24_8_;
  *(undefined1 (*) [32])
   &(this->bb).items.
    super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::item>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar18;
  auVar19 = ZEXT464(0) << 0x40;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ex).items =
       (vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::maximize_tag,_float>::item>_>
        )auVar19._0_24_;
  (this->ex).flat_constraints = (vector<int,_std::allocator<int>_>)auVar19._24_24_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar19._48_8_;
  (this->ex).walkers.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar19._56_8_;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ex).constraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  uVar15 = 0;
  lVar11 = 0;
  local_90 = 0;
  local_70 = 0;
  local_38 = ((long)(csts->
                    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(csts->
                   super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x28 & 0xffffffff;
  do {
    this_00 = local_68;
    if (uVar15 == local_38) {
      if (local_70 != 0) {
        exhaustive_solver<baryonyx::itm::maximize_tag,_float>::reserve(&this->ex,local_90,local_70);
      }
      branch_and_bound_solver<baryonyx::itm::maximize_tag,_float>::reserve(local_78,local_90);
      return;
    }
    local_z_variables_max = 0;
    lVar11 = (long)(int)lVar11;
    psVar3 = (__num->_M_t).
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type_*,_false>
             ._M_head_impl;
    psVar3[uVar15] = linear;
    pmVar4 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    constraint_elements = pmVar4 + uVar15;
    lVar5 = *(long *)&pmVar4[uVar15].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl;
    pfVar6 = *(pointer *)
              ((long)&pmVar4[uVar15].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl + 8);
    piVar7 = (local_60->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    sVar9 = linear;
    bk_max = 0;
    iVar12 = 0;
    sVar8 = 1;
    for (lVar14 = 0; sVar17 = sVar8, (pointer)(lVar5 + lVar14) != pfVar6; lVar14 = lVar14 + 8) {
      iVar10 = *(int *)(lVar5 + -8 + sVar17 * 8);
      if (iVar10 == 0) {
        details::fail_fast("Postcondition","cst.factor",
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                           ,"135");
      }
      piVar7[lVar11] = iVar10;
      uVar2 = *(uint *)(lVar5 + -8 + sVar17 * 8);
      uVar16 = 0;
      if ((int)uVar2 < 0) {
        uVar16 = uVar2;
      }
      if (uVar2 - 2 < 0xfffffffd) {
        sVar9 = branch_and_bound;
        psVar3[uVar15] = branch_and_bound;
      }
      iVar12 = iVar12 + uVar16;
      lVar11 = lVar11 + 1;
      bk_max = bk_max + (~((int)uVar2 >> 0x1f) & uVar2);
      sVar8 = sVar17 + 1;
      local_z_variables_max = sVar17;
    }
    if (sVar9 == branch_and_bound && local_z_variables_max < 10) {
      sVar9 = exhaustive;
      psVar3[uVar15] = exhaustive;
    }
    iVar10 = constraint_elements->min;
    if (iVar10 == constraint_elements->max) {
      pbVar13 = (__num_00->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
                ._M_head_impl;
      pbVar13[uVar15].min = iVar10;
      bk_max = iVar10;
    }
    else {
      if ((iVar10 <= iVar12) || (bk_max <= constraint_elements->max)) {
        if (sVar9 == branch_and_bound) {
          sVar9 = unconstrained_branch_and_bound;
        }
        else {
          if (sVar9 != exhaustive) goto LAB_0045ef1e;
          sVar9 = unconstrained_exhaustive;
        }
        psVar3[uVar15] = sVar9;
      }
LAB_0045ef1e:
      if (iVar10 < iVar12) {
        iVar10 = iVar12;
      }
      pbVar13 = (__num_00->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
                ._M_head_impl;
      pbVar13[uVar15].min = iVar10;
      if (constraint_elements->max < bk_max) {
        bk_max = constraint_elements->max;
      }
    }
    pbVar13[uVar15].max = bk_max;
    if (local_90 <= local_z_variables_max) {
      local_90 = local_z_variables_max;
    }
    if ((sVar9 | unconstrained_branch_and_bound) == unconstrained_exhaustive) {
      exhaustive_solver<baryonyx::itm::maximize_tag,float>::
      build_constraints<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
                ((exhaustive_solver<baryonyx::itm::maximize_tag,float> *)&this->ex,(int)uVar15,
                 &constraint_elements->elements,iVar10,bk_max);
      local_70 = local_70 + 1;
      pbVar13 = (__num_00->_M_t).
                super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                .
                super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
                ._M_head_impl;
      sVar9 = (__num->_M_t).
              super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::subsolver_type_*,_false>
              ._M_head_impl[uVar15];
    }
    local_7c = (int)(char)sVar9;
    fmt._M_str = "Is Z: {} ({}) with {} <= {}\n";
    fmt._M_len = 0x1c;
    debug_logger<true>::log<int,unsigned_long,int,int>
              (&this_00->super_debug_logger<true>,fmt,&local_7c,&local_z_variables_max,
               &pbVar13[uVar15].min,&pbVar13[uVar15].max);
    pbVar13 = (this_00->b)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor_*,_false>
              ._M_head_impl;
    if (pbVar13[uVar15].max < pbVar13[uVar15].min) {
      details::fail_fast("Postcondition","b[i].min <= b[i].max",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-Z.cpp"
                         ,"182");
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

solver_inequalities_Zcoeff(random_engine& rng_,
                               int m_,
                               int n_,
                               const cost_type& c_,
                               const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_Zcoeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , Z(std::make_unique<subsolver_type[]>(m_))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        // Count the maximum function elements in the constraint where a least
        // one coefficient is in Z. To be use with the branch-and-bound and
        // exhaustive solvers.
        std::size_t z_variables_max = 0;

        // Count the maximum constraint number where at leat one coefficient is
        // in Z. To be used with the exhaustive solver.
        std::size_t z_constraint_exhaustive = 0;

        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;
            std::size_t local_z_variables_max = 0;

            Z[i] =
              subsolver_type::linear; // Default, Z solver use the classical
                                      // Bastert selection for 101 problem.

            for (const auto& cst : csts[i].elements) {
                bx_ensures(cst.factor);
                A[id++] = cst.factor;
                ++local_z_variables_max;

                if (cst.factor > 0)
                    upper += cst.factor;
                else
                    lower += cst.factor;

                if (cst.factor < -1 || cst.factor > 1) {
                    Z[i] = subsolver_type::branch_and_bound;
                }
            }

            if (Z[i] == subsolver_type::branch_and_bound &&
                local_z_variables_max < maximum_factor_exhaustive_solver)
                Z[i] = subsolver_type::exhaustive;

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                if (lower >= csts[i].min || upper <= csts[i].max) {
                    if (Z[i] == subsolver_type::branch_and_bound)
                        Z[i] = subsolver_type::unconstrained_branch_and_bound;
                    else if (Z[i] == subsolver_type::exhaustive)
                        Z[i] = subsolver_type::unconstrained_exhaustive;
                }

                b[i].min = std::max(lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            z_variables_max = std::max(z_variables_max, local_z_variables_max);

            if (Z[i] == subsolver_type::exhaustive ||
                Z[i] == subsolver_type::unconstrained_exhaustive) {
                z_constraint_exhaustive++;
                ex.build_constraints(i, csts[i].elements, b[i].min, b[i].max);
            }

            logger::log("Is Z: {} ({}) with {} <= {}\n",
                        static_cast<int>(Z[i]),
                        local_z_variables_max,
                        b[i].min,
                        b[i].max);

            bx_ensures(b[i].min <= b[i].max);
        }

        if (z_constraint_exhaustive > 0)
            ex.reserve(z_variables_max, z_constraint_exhaustive);

        bb.reserve(z_variables_max);
    }